

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

Ast __thiscall lambda::reduce(lambda *this,Parse_ast *ast)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Ast AVar2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  context;
  Context local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_28.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AVar2 = anon_unknown_1::reduce_rec((anon_unknown_1 *)this,ast,&local_28);
  _Var1._M_pi = AVar2.underlying_.
                super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_28.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  AVar2.underlying_.
  super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  AVar2.underlying_.
  super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ast)AVar2.underlying_.
              super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ast reduce(Parse_ast const& ast) {
  std::vector<std::string_view> context;
  return reduce_rec(ast, context);
}